

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O3

module_ __thiscall pybind11::module_::def_submodule(module_ *this,char *name,char *doc)

{
  char **ppcVar1;
  long *plVar2;
  char *pcVar3;
  undefined8 *puVar4;
  handle obj;
  char *in_RCX;
  ulong uVar5;
  string full_name;
  allocator<char> local_da;
  allocator<char> local_d9;
  char **local_d8;
  PyObject *local_d0;
  char *local_c8;
  object oStack_c0;
  long *local_b8;
  undefined8 local_b0;
  long local_a8;
  undefined8 uStack_a0;
  handle local_98;
  long local_90;
  PyObject local_88;
  char **local_78;
  long local_70;
  char *local_68 [2];
  ulong *local_58;
  long local_50;
  ulong local_48 [2];
  char *local_38;
  
  pcVar3 = (char *)PyModule_GetName(*(undefined8 *)name);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,pcVar3,&local_d9);
  local_58 = local_48;
  local_38 = in_RCX;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,".","");
  uVar5 = 0xf;
  if (local_98.m_ptr != &local_88) {
    uVar5 = local_88.ob_refcnt;
  }
  if (uVar5 < (ulong)(local_50 + local_90)) {
    uVar5 = 0xf;
    if (local_58 != local_48) {
      uVar5 = local_48[0];
    }
    if (uVar5 < (ulong)(local_50 + local_90)) goto LAB_0011f231;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_58,0,(char *)0x0,(ulong)local_98.m_ptr);
  }
  else {
LAB_0011f231:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_98,(ulong)local_58);
  }
  local_d8 = &local_c8;
  ppcVar1 = (char **)(puVar4 + 2);
  if ((char **)*puVar4 == ppcVar1) {
    local_c8 = *ppcVar1;
    oStack_c0.super_handle.m_ptr = (handle)puVar4[3];
  }
  else {
    local_c8 = *ppcVar1;
    local_d8 = (char **)*puVar4;
  }
  local_d0 = (PyObject *)puVar4[1];
  *puVar4 = ppcVar1;
  puVar4[1] = 0;
  *(undefined1 *)ppcVar1 = 0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,doc,&local_da);
  pcVar3 = (char *)0xf;
  if (local_d8 != &local_c8) {
    pcVar3 = local_c8;
  }
  if (pcVar3 < (char *)(local_70 + (long)local_d0)) {
    pcVar3 = (char *)0xf;
    if (local_78 != local_68) {
      pcVar3 = local_68[0];
    }
    if ((char *)(local_70 + (long)local_d0) <= pcVar3) {
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_78,0,(char *)0x0,(ulong)local_d8);
      goto LAB_0011f30f;
    }
  }
  puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_d8,(ulong)local_78);
LAB_0011f30f:
  local_b8 = &local_a8;
  plVar2 = puVar4 + 2;
  if ((long *)*puVar4 == plVar2) {
    local_a8 = *plVar2;
    uStack_a0 = puVar4[3];
  }
  else {
    local_a8 = *plVar2;
    local_b8 = (long *)*puVar4;
  }
  local_b0 = puVar4[1];
  *puVar4 = plVar2;
  puVar4[1] = 0;
  *(undefined1 *)plVar2 = 0;
  if (local_78 != local_68) {
    operator_delete(local_78,(ulong)(local_68[0] + 1));
  }
  if (local_d8 != &local_c8) {
    operator_delete(local_d8,(ulong)(local_c8 + 1));
  }
  if (local_58 != local_48) {
    operator_delete(local_58,local_48[0] + 1);
  }
  if (local_98.m_ptr != &local_88) {
    operator_delete(local_98.m_ptr,local_88.ob_refcnt + 1);
  }
  obj.m_ptr = (PyObject *)PyImport_AddModule(local_b8);
  (this->super_object).super_handle.m_ptr = obj.m_ptr;
  if (obj.m_ptr != (PyObject *)0x0) {
    (obj.m_ptr)->ob_refcnt = (obj.m_ptr)->ob_refcnt + 1;
  }
  if ((local_38 != (char *)0x0) && (options::global_state()::instance == '\x01')) {
    str::str((str *)&local_98,local_38);
    local_c8 = "__doc__";
    oStack_c0.super_handle.m_ptr = (handle)(PyObject *)0x0;
    local_d0 = obj.m_ptr;
    detail::accessor_policies::str_attr::set(obj,"__doc__",local_98);
    object::~object(&oStack_c0);
    object::~object((object *)&local_98);
  }
  local_d0 = *(PyObject **)name;
  oStack_c0.super_handle.m_ptr = (handle)(PyObject *)0x0;
  local_c8 = doc;
  detail::accessor_policies::str_attr::set((handle)local_d0,doc,obj);
  object::~object(&oStack_c0);
  if (local_b8 != &local_a8) {
    operator_delete(local_b8,local_a8 + 1);
  }
  return (object)(object)this;
}

Assistant:

module_ def_submodule(const char *name, const char *doc = nullptr) {
        std::string full_name = std::string(PyModule_GetName(m_ptr))
            + std::string(".") + std::string(name);
        auto result = reinterpret_borrow<module_>(PyImport_AddModule(full_name.c_str()));
        if (doc && options::show_user_defined_docstrings())
            result.attr("__doc__") = pybind11::str(doc);
        attr(name) = result;
        return result;
    }